

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O3

WebPEncodingError
SetFrame(WebPAnimEncoder *enc,WebPConfig *config,int is_key_frame,EncodedFrame *encoded_frame,
        int *frame_skipped)

{
  WebPPicture *dst;
  int is_lossless;
  int is_first_frame;
  uint8_t *puVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  WebPMuxFrameInfo *pWVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  WebPEncodingError WVar11;
  ulong uVar12;
  EncodedFrame *pEVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  size_t *psVar17;
  WebPConfig *pWVar18;
  ulong uVar19;
  WebPConfig *pWVar20;
  WebPMuxAnimDispose WVar21;
  EncodedFrame *pEVar22;
  bool bVar23;
  WebPConfig config_lossy;
  WebPConfig config_ll;
  SubFrameParams dispose_none_params;
  Candidate candidates [4];
  SubFrameParams dispose_bg_params;
  
  is_lossless = config->lossless;
  iVar9 = (enc->options_).allow_mixed;
  is_first_frame = enc->is_first_frame_;
  bVar23 = false;
  if (is_key_frame == 0) {
    bVar23 = enc->prev_candidate_undecided_ == 0;
  }
  pWVar18 = config;
  pWVar20 = &config_ll;
  for (lVar15 = 0x1d; lVar15 != 0; lVar15 = lVar15 + -1) {
    pWVar20->lossless = pWVar18->lossless;
    pWVar18 = (WebPConfig *)&pWVar18->quality;
    pWVar20 = (WebPConfig *)&pWVar20->quality;
  }
  pWVar18 = config;
  pWVar20 = &config_lossy;
  for (lVar15 = 0x1d; lVar15 != 0; lVar15 = lVar15 + -1) {
    pWVar20->lossless = pWVar18->lossless;
    pWVar18 = (WebPConfig *)&pWVar18->quality;
    pWVar20 = (WebPConfig *)&pWVar20->quality;
  }
  config_ll.lossless = 1;
  config_lossy.lossless = 0;
  pWVar18 = config;
  pWVar20 = &enc->last_config_;
  for (lVar15 = 0x1d; lVar15 != 0; lVar15 = lVar15 + -1) {
    pWVar20->lossless = pWVar18->lossless;
    pWVar18 = (WebPConfig *)&pWVar18->quality;
    pWVar20 = (WebPConfig *)&pWVar20->quality;
  }
  pWVar18 = &config_lossy;
  if (config->lossless == 0) {
    pWVar18 = &config_ll;
  }
  pWVar20 = &enc->last_config_reversed_;
  for (lVar15 = 0x1d; lVar15 != 0; lVar15 = lVar15 + -1) {
    pWVar20->lossless = pWVar18->lossless;
    pWVar18 = (WebPConfig *)&pWVar18->quality;
    pWVar20 = (WebPConfig *)&pWVar20->quality;
  }
  *frame_skipped = 0;
  iVar8 = SubFrameParamsInit(&dispose_none_params,1,(uint)(is_first_frame == 0));
  if (iVar8 == 0) {
    return VP8_ENC_ERROR_INVALID_CONFIGURATION;
  }
  iVar8 = SubFrameParamsInit(&dispose_bg_params,0,0);
  if (iVar8 == 0) {
    return VP8_ENC_ERROR_INVALID_CONFIGURATION;
  }
  memset(candidates,0,0x1a0);
  iVar8 = GetSubRects(&enc->prev_canvas_,&enc->curr_canvas_copy_,is_key_frame,is_first_frame,
                      config_lossy.quality,&dispose_none_params);
  WVar11 = VP8_ENC_ERROR_INVALID_CONFIGURATION;
  if (iVar8 == 0) {
LAB_0014dcfd:
    lVar15 = 0;
    do {
      if (*(int *)((long)((FrameRectangle *)(&candidates[0].info_ + 1) + 1) + lVar15) != 0) {
        WebPMemoryWriterClear((WebPMemoryWriter *)((long)candidates[0].mem_.pad + lVar15 + -0x18));
      }
      lVar15 = lVar15 + 0x68;
    } while (lVar15 != 0x1a0);
  }
  else {
    if (((iVar9 == 0 && is_lossless == 0) ||
        ((dispose_none_params.rect_ll_.width_ != 0 && (dispose_none_params.rect_ll_.height_ != 0))))
       && ((is_lossless != 0 && iVar9 == 0 ||
           ((dispose_none_params.rect_lossy_.width_ != 0 &&
            (dispose_none_params.rect_lossy_.height_ != 0)))))) {
      if (bVar23) {
        dst = &enc->prev_canvas_disposed_;
        WebPCopyPixels(&enc->prev_canvas_,dst);
        WebPUtilClearPic(dst,&enc->prev_rect_);
        iVar9 = GetSubRects(dst,&enc->curr_canvas_copy_,is_key_frame,is_first_frame,
                            config_lossy.quality,&dispose_bg_params);
        if (iVar9 == 0) goto LAB_0014dcfd;
        if ((enc->options_).minimize_size != 0) {
          dispose_bg_params.should_try_ = 1;
          dispose_none_params.should_try_ = 1;
          goto LAB_0014dc95;
        }
        if (is_lossless == 0) {
          uVar10 = dispose_bg_params.rect_lossy_.height_ * dispose_bg_params.rect_lossy_.width_;
          uVar14 = dispose_none_params.rect_lossy_.height_ * dispose_none_params.rect_lossy_.width_;
        }
        else {
          uVar10 = dispose_bg_params.rect_ll_.height_ * dispose_bg_params.rect_ll_.width_;
          uVar14 = dispose_none_params.rect_ll_.height_ * dispose_none_params.rect_ll_.width_;
        }
        if (uVar14 <= uVar10) goto LAB_0014dc7e;
        dispose_bg_params.should_try_ = 1;
        dispose_none_params.should_try_ = 0;
LAB_0014dccb:
        WVar11 = GenerateCandidates(enc,candidates,WEBP_MUX_DISPOSE_BACKGROUND,is_lossless,
                                    is_key_frame,&dispose_bg_params,&config_ll,&config_lossy);
        if (WVar11 != VP8_ENC_OK) goto LAB_0014dcfd;
      }
      else {
LAB_0014dc7e:
        if (dispose_none_params.should_try_ != 0) {
LAB_0014dc95:
          WVar11 = GenerateCandidates(enc,candidates,WEBP_MUX_DISPOSE_NONE,is_lossless,is_key_frame,
                                      &dispose_none_params,&config_ll,&config_lossy);
          if (WVar11 != VP8_ENC_OK) goto LAB_0014dcfd;
        }
        if (dispose_bg_params.should_try_ != 0) goto LAB_0014dccb;
      }
      uVar16 = 0xffffffffffffffff;
      uVar12 = 0xffffffff;
      psVar17 = &candidates[0].mem_.size;
      uVar19 = 0;
      do {
        if (((int)psVar17[0xb] != 0) && (*psVar17 < uVar16)) {
          uVar12 = uVar19 & 0xffffffff;
          uVar16 = *psVar17;
        }
        uVar19 = uVar19 + 1;
        psVar17 = psVar17 + 0xd;
      } while (uVar19 != 4);
      pEVar22 = (EncodedFrame *)&encoded_frame->key_frame_;
      if (is_key_frame == 0) {
        pEVar22 = encoded_frame;
      }
      lVar15 = 0;
      do {
        if (*(int *)((long)((FrameRectangle *)(&candidates[0].info_ + 1) + 1) + lVar15) != 0) {
          if (uVar12 * 0x68 - lVar15 == 0) {
            puVar1 = *(uint8_t **)((long)candidates[0].info_.pad + lVar15 + -0x28);
            sVar2 = *(size_t *)((long)candidates[0].info_.pad + lVar15 + -0x20);
            uVar3 = *(undefined8 *)((long)candidates[0].info_.pad + lVar15 + -0x18);
            uVar4 = *(undefined8 *)((long)candidates[0].info_.pad + lVar15 + -0x10);
            uVar5 = *(undefined8 *)((long)candidates[0].info_.pad + lVar15 + -8);
            uVar6 = *(undefined8 *)((long)candidates[0].info_.pad + lVar15);
            (pEVar22->sub_frame_).dispose_method = (int)uVar5;
            (pEVar22->sub_frame_).blend_method = (int)((ulong)uVar5 >> 0x20);
            *(undefined8 *)(pEVar22->sub_frame_).pad = uVar6;
            (pEVar22->sub_frame_).x_offset = (int)uVar3;
            (pEVar22->sub_frame_).y_offset = (int)((ulong)uVar3 >> 0x20);
            (pEVar22->sub_frame_).duration = (int)uVar4;
            (pEVar22->sub_frame_).id = (int)((ulong)uVar4 >> 0x20);
            (pEVar22->sub_frame_).bitstream.bytes = puVar1;
            (pEVar22->sub_frame_).bitstream.size = sVar2;
            sVar2 = *(size_t *)((long)candidates[0].mem_.pad + lVar15 + -0x10);
            (pEVar22->sub_frame_).bitstream.bytes =
                 *(uint8_t **)((long)candidates[0].mem_.pad + lVar15 + -0x18);
            (pEVar22->sub_frame_).bitstream.size = sVar2;
            if (is_key_frame == 0) {
              pEVar13 = enc->encoded_frames_ + enc->start_ + enc->count_;
              WVar21 = (WebPMuxAnimDispose)((uVar12 & 0xfffffffd) != 0);
              if (enc->prev_candidate_undecided_ == 0) {
                if (pEVar13[-2].is_key_frame_ != 0) {
                  pEVar13 = (EncodedFrame *)&pEVar13->key_frame_;
                }
                pWVar7 = &pEVar13[-2].sub_frame_;
              }
              else {
                pEVar13[-2].sub_frame_.dispose_method = WVar21;
                pWVar7 = &pEVar13[-2].key_frame_;
              }
              pWVar7->dispose_method = WVar21;
            }
            uVar3 = *(undefined8 *)((long)(&candidates[0].info_ + 1) + 0x28 + lVar15 + -0x28);
            uVar4 = *(undefined8 *)((long)(&candidates[0].info_ + 1) + 0x28 + lVar15 + -0x20);
            (enc->prev_rect_).x_offset_ = (int)uVar3;
            (enc->prev_rect_).y_offset_ = (int)((ulong)uVar3 >> 0x20);
            (enc->prev_rect_).width_ = (int)uVar4;
            (enc->prev_rect_).height_ = (int)((ulong)uVar4 >> 0x20);
          }
          else {
            WebPMemoryWriterClear
                      ((WebPMemoryWriter *)((long)candidates[0].mem_.pad + lVar15 + -0x18));
            *(undefined4 *)((long)((FrameRectangle *)(&candidates[0].info_ + 1) + 1) + lVar15) = 0;
          }
        }
        lVar15 = lVar15 + 0x68;
      } while (lVar15 != 0x1a0);
    }
    else {
      *frame_skipped = 1;
    }
    WVar11 = VP8_ENC_OK;
  }
  WebPPictureFree(&dispose_none_params.sub_frame_ll_);
  WebPPictureFree(&dispose_none_params.sub_frame_lossy_);
  WebPPictureFree(&dispose_bg_params.sub_frame_ll_);
  WebPPictureFree(&dispose_bg_params.sub_frame_lossy_);
  return WVar11;
}

Assistant:

static int SetFrame(int frame_num, WebPIterator* const iter) {
  const Frame* frame;
  const WebPDemuxer* const dmux = (WebPDemuxer*)iter->private_;
  if (dmux == NULL || frame_num < 0) return 0;
  if (frame_num > dmux->num_frames_) return 0;
  if (frame_num == 0) frame_num = dmux->num_frames_;

  frame = GetFrame(dmux, frame_num);
  if (frame == NULL) return 0;

  return SynthesizeFrame(dmux, frame, iter);
}